

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar10;
  Mat *pMVar8;
  undefined8 uVar9;
  undefined1 auVar11 [32];
  int iVar12;
  undefined4 uVar13;
  size_t sVar14;
  size_t sVar15;
  float fVar16;
  int *piVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  Mat *top_blob_00;
  long lVar26;
  long lVar27;
  void *pvVar28;
  int iVar29;
  ulong uVar30;
  void *pvVar31;
  float *pfVar32;
  ulong uVar33;
  int iVar34;
  undefined8 *puVar35;
  undefined8 *puVar36;
  float *pfVar37;
  float *pfVar38;
  long lVar39;
  bool bVar40;
  int K;
  int iVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  undefined1 (*pauVar45) [16];
  int iVar46;
  void *pvVar47;
  Allocator **ppAVar48;
  uint uVar49;
  undefined1 (*pauVar50) [32];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  float tmp [2] [4] [8];
  Allocator *_allocator;
  ulong local_370;
  uint local_324;
  ulong local_308;
  int local_2e4;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  void *local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  long local_2a0;
  void *local_298;
  long local_290;
  uint local_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  uint local_274;
  Mat local_270;
  Mat local_220;
  ulong local_1d8;
  Mat local_1d0;
  ulong local_188;
  Mat *local_180;
  void *local_178;
  ulong local_170;
  ulong local_168;
  undefined1 local_160 [16];
  ulong uStack_150;
  int iStack_148;
  Allocator *local_140;
  int iStack_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  size_t local_120 [8];
  float local_e0 [44];
  undefined1 auVar66 [32];
  
  uVar7 = top_blob->w;
  uVar10 = top_blob->h;
  auVar55._4_4_ = uVar10;
  auVar55._0_4_ = uVar7;
  auVar52 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar55._8_8_ = 0;
  auVar52 = vpsubd_avx(auVar55,auVar52);
  auVar55 = vpsrld_avx(auVar52,0x1f);
  auVar52 = vpaddd_avx(auVar52,auVar55);
  auVar52 = vpsrad_avx(auVar52,1);
  uVar49 = top_blob->elempack * top_blob->c;
  uVar42 = auVar52._4_4_ * auVar52._0_4_;
  uVar30 = (ulong)uVar42;
  K = bottom_blob->elempack * bottom_blob->c;
  local_180 = bias;
  get_optimal_tile_mnk(uVar49,uVar42,K,(int *)&local_274,&local_278,&local_2e4,nT);
  iVar12 = local_278;
  iVar22 = local_2e4;
  uVar19 = (int)(uVar49 + local_274 + -1) / (int)local_274;
  iVar20 = (int)(local_278 + uVar42 + -1) / local_278;
  iVar46 = (K + local_2e4 + -1) / local_2e4;
  iVar29 = local_2e4 * local_278;
  _allocator = opt->workspace_allocator;
  local_220.cstep = 0;
  local_220.data = (void *)0x0;
  local_220.refcount._0_4_ = 0;
  local_220.refcount._4_4_ = 0;
  local_220.elemsize = 0;
  local_220.elempack = 0;
  local_220.allocator = (Allocator *)0x0;
  local_220.dims = 0;
  local_220.w = 0;
  local_220.h = 0;
  local_220.d = 0;
  local_220.c = 0;
  local_188 = (ulong)uVar49;
  Mat::create(&local_220,iVar29,0x10,iVar46,iVar20,4,_allocator);
  iVar20 = iVar46 * iVar20;
  iVar29 = iVar29 * 0x10;
  local_2e0 = uVar30;
  if ((nT < 2) || (nT <= iVar20)) {
    local_120[0] = 0;
    local_160._0_8_ = (Allocator *)0x0;
    local_160._8_4_ = 0;
    local_160._12_4_ = 0;
    uStack_150 = 0;
    iStack_148 = 0;
    local_140 = (Allocator *)0x0;
    iStack_138 = 0;
    iStack_134 = 0;
    iStack_130 = 0;
    iStack_12c = 0;
    iStack_128 = 0;
    Mat::create((Mat *)local_160,iVar29,1,nT,4,opt->workspace_allocator);
    if (0 < iVar20) {
      iVar29 = 0;
      do {
        iVar34 = iVar12 * (iVar29 / iVar46);
        iVar24 = iVar22 * (iVar29 % iVar46);
        iVar43 = (int)uVar30 - iVar34;
        if (iVar12 < iVar43) {
          iVar43 = iVar12;
        }
        iVar41 = K - iVar24;
        if (iVar22 < iVar41) {
          iVar41 = iVar22;
        }
        iVar21 = get_omp_thread_num();
        local_270.data = (void *)(local_160._0_8_ + (long)iVar21 * local_120[0] * uStack_150);
        local_270.refcount._0_4_ = 0;
        local_270.refcount._4_4_ = 0;
        local_270.elemsize = uStack_150;
        local_270.elempack = iStack_148;
        local_270.allocator = local_140;
        local_270.w = iStack_134;
        local_270.h = iStack_130;
        local_270.d = 1;
        local_270.c = iStack_12c;
        local_270.dims = iStack_138 + -1;
        local_270.cstep =
             (uStack_150 * (long)iStack_130 * (long)iStack_134 + 0xf & 0xfffffffffffffff0) /
             uStack_150;
        if (iStack_138 == 4) {
          local_270.cstep = (long)iStack_130 * (long)iStack_134;
        }
        conv3x3s1_winograd23_transform_input_tile
                  (bottom_blob,&local_270,iVar34,iVar43,iVar24,iVar41,(int)_allocator);
        local_1d0.cstep = (long)local_220.h * (long)local_220.w;
        local_1d0.data =
             (void *)((long)local_220.data +
                     (uint)(iVar29 % iVar46) * local_220.elemsize * local_1d0.cstep +
                     (long)(iVar29 / iVar46) * local_220.cstep * local_220.elemsize);
        local_1d0.refcount = (int *)0x0;
        local_1d0.elemsize = local_220.elemsize;
        local_1d0.elempack = local_220.elempack;
        local_1d0.allocator = local_220.allocator;
        local_1d0.dims = 2;
        local_1d0.w = local_220.w;
        local_1d0.h = local_220.h;
        local_1d0.d = 1;
        local_1d0.c = 1;
        transpose_pack_B_tile(&local_270,&local_1d0,0x10,iVar43,iVar41,(int)local_1d0.cstep);
        iVar29 = iVar29 + 1;
        uVar30 = local_2e0;
      } while (iVar20 != iVar29);
    }
    piVar17 = (int *)CONCAT44(local_160._12_4_,local_160._8_4_);
    if (piVar17 == (int *)0x0) goto LAB_002230ae;
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 != 0) goto LAB_002230ae;
    if (local_140 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_140 + 0x18))();
      goto LAB_002230ae;
    }
  }
  else {
    local_120[0] = 0;
    local_160._0_8_ = (Allocator *)0x0;
    local_160._8_4_ = 0;
    local_160._12_4_ = 0;
    uStack_150 = 0;
    iStack_148 = 0;
    local_140 = (Allocator *)0x0;
    iStack_138 = 0;
    iStack_134 = 0;
    iStack_130 = 0;
    iStack_12c = 0;
    iStack_128 = 0;
    Mat::create((Mat *)local_160,iVar29,4,opt->workspace_allocator);
    if (0 < iVar20) {
      iVar29 = 0;
      do {
        iVar24 = iVar12 * (iVar29 / iVar46);
        iVar34 = iVar22 * (int)((long)iVar29 % (long)iVar46);
        iVar43 = (int)local_2e0 - iVar24;
        if (iVar12 < iVar43) {
          iVar43 = iVar12;
        }
        iVar41 = K - iVar34;
        if (iVar22 < iVar41) {
          iVar41 = iVar22;
        }
        conv3x3s1_winograd23_transform_input_tile
                  (bottom_blob,(Mat *)local_160,iVar24,iVar43,iVar34,iVar41,(int)_allocator);
        local_270.cstep = (long)local_220.h * (long)local_220.w;
        local_270.data =
             (void *)((long)local_220.data +
                     ((long)iVar29 % (long)iVar46 & 0xffffffffU) * local_220.elemsize *
                     local_270.cstep +
                     (long)(iVar29 / iVar46) * local_220.cstep * local_220.elemsize);
        local_270.refcount._0_4_ = 0;
        local_270.refcount._4_4_ = 0;
        local_270.elemsize = local_220.elemsize;
        local_270.elempack = local_220.elempack;
        local_270.allocator = local_220.allocator;
        local_270.dims = 2;
        local_270.w = local_220.w;
        local_270.h = local_220.h;
        local_270.d = 1;
        local_270.c = 1;
        transpose_pack_B_tile((Mat *)local_160,&local_270,0x10,iVar43,iVar41,(int)local_270.cstep);
        iVar29 = iVar29 + 1;
      } while (iVar20 != iVar29);
    }
    piVar17 = (int *)CONCAT44(local_160._12_4_,local_160._8_4_);
    if (piVar17 == (int *)0x0) goto LAB_002230ae;
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 != 0) goto LAB_002230ae;
    if (local_140 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_140 + 0x18))();
      goto LAB_002230ae;
    }
  }
  if ((Allocator *)local_160._0_8_ != (Allocator *)0x0) {
    free((void *)local_160._0_8_);
  }
LAB_002230ae:
  uVar30 = (ulong)local_278;
  local_288 = local_274;
  local_270.cstep = 0;
  local_270.data = (void *)0x0;
  local_270.refcount._0_4_ = 0;
  local_270.refcount._4_4_ = 0;
  local_270.elemsize = 0;
  local_270.elempack = 0;
  local_270.allocator = (Allocator *)0x0;
  local_270.dims = 0;
  local_270.w = 0;
  local_270.h = 0;
  local_270.d = 0;
  local_270.c = 0;
  Mat::create(&local_270,local_278 * local_274 * 0x10,1,nT,4,opt->workspace_allocator);
  if (0 < (int)uVar19) {
    local_324 = 0;
    local_2d0 = uVar30;
    do {
      iVar22 = get_omp_thread_num();
      uVar49 = local_288 * local_324;
      local_2b8 = (ulong)uVar49;
      uVar42 = (int)local_188 - uVar49;
      if ((int)local_288 < (int)uVar42) {
        uVar42 = local_288;
      }
      if (0 < (int)local_2e0) {
        top_blob_00 = (Mat *)((long)iVar22 * local_270.cstep * local_270.elemsize +
                             (long)local_270.data);
        lVar23 = (long)(int)uVar49;
        local_170 = (ulong)uVar42;
        local_2a0 = (long)(int)uVar42;
        local_2b0 = (ulong)local_324;
        iVar22 = 0;
        uVar33 = local_2e0 & 0xffffffff;
        do {
          iVar12 = local_2e4;
          local_284 = (int)uVar33;
          if ((int)uVar30 < local_284) {
            uVar33 = uVar30 & 0xffffffff;
          }
          local_168 = (long)local_284;
          if ((long)uVar30 < (long)local_284) {
            local_168 = uVar30;
          }
          uVar49 = (int)local_2e0 - iVar22;
          pvVar47 = (void *)(ulong)uVar49;
          if ((int)uVar30 < (int)uVar49) {
            pvVar47 = (void *)(uVar30 & 0xffffffff);
          }
          iVar20 = (int)pvVar47;
          local_2d8 = uVar33;
          if (0 < K) {
            iVar46 = iVar22 / (int)local_2d0;
            iVar43 = 0;
            iVar29 = K;
            do {
              iVar24 = iVar29;
              if (iVar12 < iVar29) {
                iVar24 = iVar12;
              }
              iStack_134 = AT->w;
              iStack_130 = AT->h;
              uStack_150 = AT->elemsize;
              iStack_148 = AT->elempack;
              local_140 = AT->allocator;
              local_120[0] = (long)iStack_130 * (long)iStack_134;
              local_160._0_8_ =
                   (long)AT->data +
                   uStack_150 * local_120[0] * (long)(iVar43 / iVar12) +
                   AT->cstep * local_2b0 * uStack_150;
              local_160._8_4_ = 0;
              local_160._12_4_ = 0;
              iStack_138 = 2;
              iStack_12c = 1;
              iStack_128 = 1;
              local_1d0.cstep = (long)local_220.h * (long)local_220.w;
              local_1d0.data =
                   (void *)((long)local_220.data +
                           local_220.elemsize * local_1d0.cstep * (long)(iVar43 / iVar12) +
                           local_220.cstep * (long)iVar46 * local_220.elemsize);
              local_1d0.refcount = (int *)0x0;
              local_1d0.elemsize = local_220.elemsize;
              local_1d0.elempack = local_220.elempack;
              local_1d0.allocator = local_220.allocator;
              local_1d0.dims = 2;
              local_1d0.w = local_220.w;
              local_1d0.h = local_220.h;
              local_1d0.d = 1;
              local_1d0.c = 1;
              iVar29 = -(iVar12 - iVar29);
              gemm_transB_packed_tile
                        ((Mat *)local_160,&local_1d0,top_blob_00,0x10,uVar42,iVar20,iVar43,iVar24);
              iVar43 = iVar43 + iVar12;
            } while (iVar43 < K);
          }
          iVar24 = (int)local_2d8;
          local_27c = iVar24 * 0x10;
          lVar39 = (long)(iVar24 * 8);
          iVar12 = top_blob->w;
          iVar29 = top_blob->elempack;
          iVar46 = top_blob->h;
          uVar49 = (int)top_blob->cstep * iVar29;
          local_2c0 = (ulong)uVar49;
          iVar43 = (iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1;
          uVar30 = 0;
          local_2c8 = local_180->data;
          if (7 < (int)uVar42) {
            local_280 = iVar24 * 0x80;
            local_178 = (void *)((long)local_2c8 + lVar23 * 4);
            lVar26 = (long)(int)uVar49;
            local_2a8 = 0;
            uVar30 = 0;
            do {
              local_1d8 = uVar30;
              if (local_2c8 == (void *)0x0) {
                auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                auVar53 = *(undefined1 (*) [32])((long)local_178 + local_1d8 * 4);
              }
              if (0 < iVar20) {
                pfVar37 = (float *)((long)&top_blob_00->data + (long)(int)local_2a8 * 4);
                local_290 = (long)(((int)local_2b8 + (int)local_1d8) / iVar29);
                pvVar28 = (void *)0x0;
                do {
                  iVar34 = iVar22 + (int)pvVar28;
                  lVar27 = 0x80;
                  pfVar32 = pfVar37;
                  do {
                    auVar11 = *(undefined1 (*) [32])(pfVar32 + lVar39);
                    auVar59 = *(undefined1 (*) [32])(pfVar32 + local_27c);
                    auVar69._0_4_ = auVar11._0_4_ + *pfVar32 + auVar59._0_4_;
                    auVar69._4_4_ = auVar11._4_4_ + pfVar32[1] + auVar59._4_4_;
                    auVar69._8_4_ = auVar11._8_4_ + pfVar32[2] + auVar59._8_4_;
                    auVar69._12_4_ = auVar11._12_4_ + pfVar32[3] + auVar59._12_4_;
                    auVar69._16_4_ = auVar11._16_4_ + pfVar32[4] + auVar59._16_4_;
                    auVar69._20_4_ = auVar11._20_4_ + pfVar32[5] + auVar59._20_4_;
                    auVar69._24_4_ = auVar11._24_4_ + pfVar32[6] + auVar59._24_4_;
                    auVar69._28_4_ = auVar11._28_4_ + pfVar32[7] + auVar59._28_4_;
                    auVar11 = vsubps_avx(auVar11,auVar59);
                    pfVar38 = pfVar32 + iVar24 * 0x18;
                    auVar59._0_4_ = auVar11._0_4_ + *pfVar38;
                    auVar59._4_4_ = auVar11._4_4_ + pfVar38[1];
                    auVar59._8_4_ = auVar11._8_4_ + pfVar38[2];
                    auVar59._12_4_ = auVar11._12_4_ + pfVar38[3];
                    auVar59._16_4_ = auVar11._16_4_ + pfVar38[4];
                    auVar59._20_4_ = auVar11._20_4_ + pfVar38[5];
                    auVar59._24_4_ = auVar11._24_4_ + pfVar38[6];
                    auVar59._28_4_ = auVar11._28_4_ + pfVar38[7];
                    *(undefined1 (*) [32])((long)&local_220.cstep + lVar27) = auVar69;
                    *(undefined1 (*) [32])(local_160 + lVar27) = auVar59;
                    lVar27 = lVar27 + 0x20;
                    pfVar32 = pfVar32 + iVar24 * 0x20;
                  } while (lVar27 != 0x100);
                  iVar41 = iVar34 % iVar43;
                  uVar25 = (iVar34 / iVar43) * 2;
                  pauVar50 = (undefined1 (*) [32])
                             ((long)top_blob->data +
                             (long)(iVar41 * 2 * iVar29) * 4 +
                             (long)top_blob->w * top_blob->elemsize * (long)(int)uVar25 +
                             top_blob->cstep * local_290 * top_blob->elemsize);
                  iVar34 = iVar41 * 2 + 1;
                  uVar44 = 0;
                  pfVar32 = (float *)local_160;
                  bVar18 = true;
                  do {
                    bVar40 = bVar18;
                    if ((int)(uVar44 | uVar25) < iVar46) {
                      auVar60._0_4_ = auVar53._0_4_ + pfVar32[8];
                      auVar60._4_4_ = auVar53._4_4_ + pfVar32[9];
                      auVar60._8_4_ = auVar53._8_4_ + pfVar32[10];
                      auVar60._12_4_ = auVar53._12_4_ + pfVar32[0xb];
                      auVar60._16_4_ = auVar53._16_4_ + pfVar32[0xc];
                      auVar60._20_4_ = auVar53._20_4_ + pfVar32[0xd];
                      auVar60._24_4_ = auVar53._24_4_ + pfVar32[0xe];
                      auVar60._28_4_ = auVar53._28_4_ + pfVar32[0xf];
                      auVar11 = *(undefined1 (*) [32])(pfVar32 + 0x10);
                      auVar62._0_4_ = auVar60._0_4_ + *pfVar32 + auVar11._0_4_;
                      auVar62._4_4_ = auVar60._4_4_ + pfVar32[1] + auVar11._4_4_;
                      auVar62._8_4_ = auVar60._8_4_ + pfVar32[2] + auVar11._8_4_;
                      auVar62._12_4_ = auVar60._12_4_ + pfVar32[3] + auVar11._12_4_;
                      auVar66._16_4_ = auVar60._16_4_ + pfVar32[4] + auVar11._16_4_;
                      auVar66._0_16_ = auVar62;
                      auVar66._20_4_ = auVar60._20_4_ + pfVar32[5] + auVar11._20_4_;
                      auVar66._24_4_ = auVar60._24_4_ + pfVar32[6] + auVar11._24_4_;
                      auVar66._28_4_ = auVar60._28_4_ + pfVar32[7] + auVar11._28_4_;
                      auVar11 = vsubps_avx(auVar60,auVar11);
                      auVar52._0_4_ = auVar11._0_4_ + pfVar32[0x18];
                      auVar52._4_4_ = auVar11._4_4_ + pfVar32[0x19];
                      auVar52._8_4_ = auVar11._8_4_ + pfVar32[0x1a];
                      auVar52._12_4_ = auVar11._12_4_ + pfVar32[0x1b];
                      auVar61._16_4_ = auVar11._16_4_ + pfVar32[0x1c];
                      auVar61._0_16_ = auVar52;
                      auVar61._20_4_ = auVar11._20_4_ + pfVar32[0x1d];
                      auVar61._24_4_ = auVar11._24_4_ + pfVar32[0x1e];
                      auVar61._28_4_ = auVar11._28_4_ + pfVar32[0x1f];
                      auVar56 = auVar66._16_16_;
                      auVar55 = auVar61._16_16_;
                      if (iVar29 == 1) {
                        *(float *)*pauVar50 = auVar62._0_4_;
                        uVar13 = vextractps_avx(auVar62,1);
                        *(undefined4 *)(*pauVar50 + lVar26 * 4) = uVar13;
                        uVar13 = vextractps_avx(auVar62,2);
                        *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 2) * 4) = uVar13;
                        uVar13 = vextractps_avx(auVar62,3);
                        *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 3) * 4) = uVar13;
                        *(float *)(*pauVar50 + (long)(int)(uVar49 * 4) * 4) = auVar66._16_4_;
                        uVar13 = vextractps_avx(auVar56,1);
                        *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 5) * 4) = uVar13;
                        uVar13 = vextractps_avx(auVar56,2);
                        *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 6) * 4) = uVar13;
                        uVar13 = vextractps_avx(auVar56,3);
                        *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 7) * 4) = uVar13;
                        if (iVar34 < iVar12) {
                          *(float *)(*pauVar50 + 4) = auVar52._0_4_;
                          uVar13 = vextractps_avx(auVar52,1);
                          *(undefined4 *)(*pauVar50 + lVar26 * 4 + 4) = uVar13;
                          uVar13 = vextractps_avx(auVar52,2);
                          *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 2) * 4 + 4) = uVar13;
                          uVar13 = vextractps_avx(auVar52,3);
                          *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 3) * 4 + 4) = uVar13;
                          *(float *)(*pauVar50 + (long)(int)(uVar49 * 4) * 4 + 4) = auVar61._16_4_;
                          uVar13 = vextractps_avx(auVar55,1);
                          *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 5) * 4 + 4) = uVar13;
                          uVar13 = vextractps_avx(auVar55,2);
                          *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 6) * 4 + 4) = uVar13;
                          uVar13 = vextractps_avx(auVar55,3);
                          *(undefined4 *)(*pauVar50 + (long)(int)(uVar49 * 7) * 4 + 4) = uVar13;
                        }
                      }
                      else if (iVar29 == 4) {
                        *(undefined1 (*) [16])*pauVar50 = auVar62;
                        *(undefined1 (*) [16])(*pauVar50 + lVar26 * 4) = auVar56;
                        if (iVar34 < iVar12) {
                          *(undefined1 (*) [16])(*pauVar50 + 0x10) = auVar52;
                          *(undefined1 (*) [16])(*pauVar50 + lVar26 * 4 + 0x10) = auVar55;
                        }
                      }
                      else if ((iVar29 == 8) && (*pauVar50 = auVar66, iVar34 < iVar12)) {
                        pauVar50[1] = auVar61;
                      }
                      pauVar50 = (undefined1 (*) [32])(*pauVar50 + (long)(iVar29 * iVar12) * 4);
                    }
                    uVar44 = 1;
                    pfVar32 = local_e0;
                    bVar18 = false;
                  } while (bVar40);
                  pvVar28 = (void *)((long)pvVar28 + 1);
                  pfVar37 = pfVar37 + 8;
                } while (pvVar28 != pvVar47);
              }
              uVar30 = local_1d8 + 8;
              local_2a8 = (ulong)(uint)((int)local_2a8 + local_280);
              local_298 = pvVar47;
            } while (local_1d8 + 0xf < local_170);
          }
          lVar26 = (long)(iVar24 * 4);
          if ((int)((uint)uVar30 | 3) < (int)uVar42) {
            local_290 = CONCAT44(local_290._4_4_,iVar24 * 0x40);
            local_298 = (void *)((long)local_2c8 + lVar23 * 4);
            iVar34 = (uint)uVar30 * iVar24 * 0x10;
            local_308 = uVar30 & 0xffffffff;
            do {
              if (local_2c8 == (void *)0x0) {
                auVar52 = (undefined1  [16])0x0;
              }
              else {
                auVar52 = *(undefined1 (*) [16])((long)local_298 + local_308 * 4);
              }
              if (0 < iVar20) {
                pfVar37 = (float *)((long)&top_blob_00->data + (long)iVar34 * 4);
                pvVar28 = (void *)0x0;
                do {
                  iVar41 = iVar22 + (int)pvVar28;
                  lVar27 = 0x40;
                  pfVar32 = pfVar37;
                  do {
                    auVar55 = *(undefined1 (*) [16])(pfVar32 + lVar26);
                    auVar62 = *(undefined1 (*) [16])(pfVar32 + lVar39);
                    auVar67._0_4_ = auVar55._0_4_ + *pfVar32 + auVar62._0_4_;
                    auVar67._4_4_ = auVar55._4_4_ + pfVar32[1] + auVar62._4_4_;
                    auVar67._8_4_ = auVar55._8_4_ + pfVar32[2] + auVar62._8_4_;
                    auVar67._12_4_ = auVar55._12_4_ + pfVar32[3] + auVar62._12_4_;
                    auVar55 = vsubps_avx(auVar55,auVar62);
                    pfVar38 = pfVar32 + iVar24 * 0xc;
                    auVar56._0_4_ = auVar55._0_4_ + *pfVar38;
                    auVar56._4_4_ = auVar55._4_4_ + pfVar38[1];
                    auVar56._8_4_ = auVar55._8_4_ + pfVar38[2];
                    auVar56._12_4_ = auVar55._12_4_ + pfVar38[3];
                    *(undefined1 (*) [16])((long)&local_1d0.h + lVar27) = auVar67;
                    *(undefined1 (*) [16])(local_160 + lVar27) = auVar56;
                    lVar27 = lVar27 + 0x10;
                    pfVar32 = pfVar32 + local_27c;
                  } while (lVar27 != 0x80);
                  iVar21 = iVar41 % iVar43;
                  uVar25 = (iVar41 / iVar43) * 2;
                  pauVar45 = (undefined1 (*) [16])
                             ((long)top_blob->data +
                             (long)(iVar21 * 2 * iVar29) * 4 +
                             (long)top_blob->w * top_blob->elemsize * (long)(int)uVar25 +
                             top_blob->cstep * (long)(((int)local_2b8 + (int)local_308) / iVar29) *
                             top_blob->elemsize);
                  iVar41 = iVar21 * 2 + 1;
                  uVar44 = 0;
                  pfVar32 = (float *)local_160;
                  bVar18 = true;
                  do {
                    bVar40 = bVar18;
                    if ((int)(uVar44 | uVar25) < iVar46) {
                      auVar57._0_4_ = auVar52._0_4_ + pfVar32[4];
                      auVar57._4_4_ = auVar52._4_4_ + pfVar32[5];
                      auVar57._8_4_ = auVar52._8_4_ + pfVar32[6];
                      auVar57._12_4_ = auVar52._12_4_ + pfVar32[7];
                      auVar55 = *(undefined1 (*) [16])(pfVar32 + 8);
                      auVar63._0_4_ = auVar57._0_4_ + *pfVar32 + auVar55._0_4_;
                      auVar63._4_4_ = auVar57._4_4_ + pfVar32[1] + auVar55._4_4_;
                      auVar63._8_4_ = auVar57._8_4_ + pfVar32[2] + auVar55._8_4_;
                      auVar63._12_4_ = auVar57._12_4_ + pfVar32[3] + auVar55._12_4_;
                      auVar55 = vsubps_avx(auVar57,auVar55);
                      auVar58._0_4_ = auVar55._0_4_ + pfVar32[0xc];
                      auVar58._4_4_ = auVar55._4_4_ + pfVar32[0xd];
                      auVar58._8_4_ = auVar55._8_4_ + pfVar32[0xe];
                      auVar58._12_4_ = auVar55._12_4_ + pfVar32[0xf];
                      if (iVar29 == 1) {
                        *(float *)*pauVar45 = auVar63._0_4_;
                        uVar13 = vextractps_avx(auVar63,1);
                        *(undefined4 *)(*pauVar45 + (long)(int)uVar49 * 4) = uVar13;
                        uVar13 = vextractps_avx(auVar63,2);
                        *(undefined4 *)(*pauVar45 + (long)(int)(uVar49 * 2) * 4) = uVar13;
                        uVar13 = vextractps_avx(auVar63,3);
                        *(undefined4 *)(*pauVar45 + (long)(int)(uVar49 * 3) * 4) = uVar13;
                        if (iVar41 < iVar12) {
                          *(float *)(*pauVar45 + 4) = auVar58._0_4_;
                          uVar13 = vextractps_avx(auVar58,1);
                          *(undefined4 *)(*pauVar45 + (long)(int)uVar49 * 4 + 4) = uVar13;
                          uVar13 = vextractps_avx(auVar58,2);
                          *(undefined4 *)(*pauVar45 + (long)(int)(uVar49 * 2) * 4 + 4) = uVar13;
                          uVar13 = vextractps_avx(auVar58,3);
                          *(undefined4 *)(*pauVar45 + (long)(int)(uVar49 * 3) * 4 + 4) = uVar13;
                        }
                      }
                      else if ((iVar29 == 4) && (*pauVar45 = auVar63, iVar41 < iVar12)) {
                        pauVar45[1] = auVar58;
                      }
                      pauVar45 = (undefined1 (*) [16])(*pauVar45 + (long)(iVar29 * iVar12) * 4);
                    }
                    uVar44 = 1;
                    pfVar32 = (float *)local_120;
                    bVar18 = false;
                  } while (bVar40);
                  pvVar28 = (void *)((long)pvVar28 + 1);
                  pfVar37 = pfVar37 + 4;
                } while (pvVar28 != pvVar47);
              }
              uVar30 = local_308 + 4;
              lVar27 = local_308 + 7;
              iVar34 = iVar34 + iVar24 * 0x40;
              local_308 = uVar30;
            } while (lVar27 < local_2a0);
            uVar30 = uVar30 & 0xffffffff;
          }
          uVar25 = (uint)uVar30;
          if ((int)(uVar25 | 1) < (int)uVar42) {
            iVar29 = top_blob->w;
            pvVar28 = top_blob->data;
            sVar14 = top_blob->elemsize;
            sVar15 = top_blob->cstep;
            iVar34 = uVar25 * iVar24 * 0x10;
            local_370 = uVar30 & 0xffffffff;
            do {
              if (local_2c8 == (void *)0x0) {
                fVar51 = 0.0;
                fVar54 = 0.0;
              }
              else {
                fVar51 = *(float *)((long)local_2c8 + (lVar23 + local_370) * 4);
                fVar54 = *(float *)((long)local_2c8 + (lVar23 + local_370) * 4 + 4);
              }
              if (0 < iVar20) {
                puVar35 = (undefined8 *)((long)&top_blob_00->data + (long)iVar34 * 4);
                pvVar31 = (void *)0x0;
                do {
                  iVar41 = iVar22 + (int)pvVar31;
                  lVar27 = 4;
                  puVar36 = puVar35;
                  do {
                    uVar30 = *(ulong *)((long)puVar36 + (long)(iVar24 * 2) * 4);
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = uVar30;
                    uVar33 = *(ulong *)((long)puVar36 + lVar26 * 4);
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar33;
                    auVar64._0_4_ = (float)uVar30 + (float)*puVar36 + (float)uVar33;
                    auVar64._4_4_ =
                         (float)(uVar30 >> 0x20) + (float)((ulong)*puVar36 >> 0x20) +
                         (float)(uVar33 >> 0x20);
                    auVar64._8_8_ = 0;
                    pMVar8 = (Mat *)vmovlps_avx(auVar64);
                    (&local_180)[lVar27] = pMVar8;
                    auVar52 = vsubps_avx(auVar68,auVar70);
                    uVar9 = *(undefined8 *)((long)puVar36 + (long)(iVar24 * 6) * 4);
                    auVar65._0_4_ = auVar52._0_4_ + (float)uVar9;
                    auVar65._4_4_ = auVar52._4_4_ + (float)((ulong)uVar9 >> 0x20);
                    auVar65._8_4_ = auVar52._8_4_ + 0.0;
                    auVar65._12_4_ = auVar52._12_4_ + 0.0;
                    uVar9 = vmovlps_avx(auVar65);
                    *(undefined8 *)(local_160 + lVar27 * 8) = uVar9;
                    lVar27 = lVar27 + 1;
                    puVar36 = (undefined8 *)((long)puVar36 + lVar39 * 4);
                  } while (lVar27 != 8);
                  iVar21 = iVar41 % iVar43;
                  uVar25 = (iVar41 / iVar43) * 2;
                  pfVar37 = (float *)((long)pvVar28 +
                                     (long)(iVar21 * 2) * 4 +
                                     (long)(int)uVar25 * (long)iVar29 * sVar14 +
                                     (lVar23 + local_370) * sVar15 * sVar14);
                  uVar44 = 0;
                  ppAVar48 = (Allocator **)local_160;
                  bVar18 = true;
                  do {
                    bVar40 = bVar18;
                    if ((int)(uVar44 | uVar25) < iVar46) {
                      fVar1 = *(float *)(ppAVar48 + 2);
                      fVar2 = *(float *)((long)ppAVar48 + 0x14);
                      fVar3 = *(float *)(ppAVar48 + 3);
                      fVar4 = *(float *)(ppAVar48 + 1);
                      fVar5 = *(float *)((long)ppAVar48 + 0x1c);
                      fVar16 = fVar54 + *(float *)((long)ppAVar48 + 0xc);
                      fVar6 = *(float *)((long)ppAVar48 + 4);
                      *pfVar37 = fVar51 + fVar4 + *(float *)ppAVar48 + fVar1;
                      pfVar37[(int)uVar49] = fVar16 + fVar6 + fVar2;
                      if (iVar21 * 2 + 1 < iVar12) {
                        pfVar37[1] = ((fVar51 + fVar4) - fVar1) + fVar3;
                        pfVar37[(long)(int)uVar49 + 1] = (fVar16 - fVar2) + fVar5;
                      }
                      pfVar37 = pfVar37 + iVar12;
                    }
                    uVar44 = 1;
                    ppAVar48 = &local_140;
                    bVar18 = false;
                  } while (bVar40);
                  pvVar31 = (void *)((long)pvVar31 + 1);
                  puVar35 = puVar35 + 1;
                } while (pvVar31 != pvVar47);
              }
              uVar30 = local_370 + 2;
              lVar27 = local_370 + 3;
              iVar34 = iVar34 + iVar24 * 0x20;
              local_370 = uVar30;
            } while (lVar27 < local_2a0);
            uVar25 = (uint)uVar30;
          }
          if ((int)uVar25 < (int)uVar42) {
            iVar29 = top_blob->w;
            pvVar28 = top_blob->data;
            sVar14 = top_blob->elemsize;
            sVar15 = top_blob->cstep;
            lVar39 = (long)(int)uVar25;
            iVar34 = uVar25 * iVar24 * 0x10;
            do {
              if (local_2c8 == (void *)0x0) {
                fVar51 = 0.0;
              }
              else {
                fVar51 = *(float *)((long)local_2c8 + lVar39 * 4 + lVar23 * 4);
              }
              if (0 < iVar20) {
                pfVar37 = (float *)((long)&top_blob_00->data + (long)iVar34 * 4);
                pvVar31 = (void *)0x0;
                do {
                  iVar41 = iVar22 + (int)pvVar31;
                  lVar27 = 4;
                  pfVar32 = pfVar37;
                  do {
                    fVar54 = pfVar32[local_168];
                    fVar1 = pfVar32[iVar24 * 2];
                    *(float *)((long)&local_170 + lVar27 * 4) = fVar54 + *pfVar32 + fVar1;
                    *(float *)(local_160 + lVar27 * 4) = (fVar54 - fVar1) + pfVar32[iVar24 * 3];
                    lVar27 = lVar27 + 1;
                    pfVar32 = pfVar32 + lVar26;
                  } while (lVar27 != 8);
                  iVar21 = iVar41 % iVar43;
                  uVar49 = (iVar41 / iVar43) * 2;
                  pfVar32 = (float *)((long)pvVar28 +
                                     (long)(iVar21 * 2) * 4 +
                                     (long)(int)uVar49 * (long)iVar29 * sVar14 +
                                     (lVar39 + lVar23) * sVar15 * sVar14);
                  uVar25 = 0;
                  pfVar38 = (float *)local_160;
                  bVar18 = true;
                  do {
                    bVar40 = bVar18;
                    if ((int)(uVar25 | uVar49) < iVar46) {
                      fVar54 = pfVar38[2];
                      fVar1 = pfVar38[1];
                      fVar2 = pfVar38[3];
                      *pfVar32 = fVar51 + fVar1 + *pfVar38 + fVar54;
                      if (iVar21 * 2 + 1 < iVar12) {
                        pfVar32[1] = ((fVar51 + fVar1) - fVar54) + fVar2;
                      }
                      pfVar32 = pfVar32 + iVar12;
                    }
                    uVar25 = 1;
                    pfVar38 = (float *)&uStack_150;
                    bVar18 = false;
                  } while (bVar40);
                  pvVar31 = (void *)((long)pvVar31 + 1);
                  pfVar37 = pfVar37 + 1;
                } while (pvVar31 != pvVar47);
              }
              lVar39 = lVar39 + 1;
              iVar34 = iVar34 + local_27c;
            } while (lVar39 != local_2a0);
          }
          iVar22 = iVar22 + (int)local_2d0;
          uVar33 = (ulong)(uint)(local_284 - (int)local_2d0);
          uVar30 = local_2d0;
        } while (iVar22 < (int)local_2e0);
      }
      local_324 = local_324 + 1;
    } while (local_324 != uVar19);
  }
  piVar17 = (int *)CONCAT44(local_270.refcount._4_4_,local_270.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_270.allocator == (Allocator *)0x0) {
        if (local_270.data != (void *)0x0) {
          free(local_270.data);
        }
      }
      else {
        (**(code **)(*(long *)local_270.allocator + 0x18))();
      }
    }
  }
  piVar17 = (int *)CONCAT44(local_220.refcount._4_4_,local_220.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_220.allocator == (Allocator *)0x0) {
        if (local_220.data != (void *)0x0) {
          free(local_220.data);
        }
      }
      else {
        (**(code **)(*(long *)local_220.allocator + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 2n+2, winograd F(2,3)
    int w_tiles = (outw + 1) / 2;
    int h_tiles = (outh + 1) / 2;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 16;

    // NCNN_LOGE("conv3x3s1_winograd23 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd23_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}